

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_kernel_tile
               (Mat *kernel,Mat *A,int inch,int i,int max_ii,int k,int max_kk)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float *ptmp;
  int local_94;
  int local_84;
  float *local_80;
  float z3;
  float z2;
  float z1;
  float z0;
  float r2_1;
  float r1_1;
  float r0_1;
  int m_1;
  float r2;
  float r1;
  float r0;
  int m;
  float *k0;
  float tmp [4] [3];
  int kk;
  int ii;
  
  tmp._8_8_ = *in_RSI;
  for (tmp[0][1] = 0.0; (int)tmp[0][1] < in_R8D; tmp[0][1] = (float)((int)tmp[0][1] + 1)) {
    for (tmp[0][0] = 0.0; (int)tmp[0][0] < k; tmp[0][0] = (float)((int)tmp[0][0] + 1)) {
      local_80 = (float *)(*in_RDI + (long)((in_ECX + (int)tmp[0][1]) * in_EDX * 9) * 4 +
                          (long)((in_R9D + (int)tmp[0][0]) * 9) * 4);
      for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
        fVar1 = *local_80;
        fVar2 = local_80[1];
        fVar3 = local_80[2];
        (&z3)[local_84] = fVar1;
        (&z0)[local_84] = fVar1 * 0.5 + fVar2 * 0.5 + fVar3 * 0.5;
        (&r0_1)[local_84] = (fVar1 * 0.5 - fVar2 * 0.5) + fVar3 * 0.5;
        (&r1)[local_84] = fVar3;
        local_80 = local_80 + 3;
      }
      for (local_94 = 0; local_94 < 4; local_94 = local_94 + 1) {
        fVar1 = (&z3)[(long)local_94 * 3];
        fVar2 = (&z2)[(long)local_94 * 3];
        fVar3 = (&z1)[(long)local_94 * 3];
        *(float *)tmp._8_8_ = fVar1;
        *(float *)(tmp._8_8_ + 4) = fVar1 * 0.5 + fVar2 * 0.5 + fVar3 * 0.5;
        *(float *)(tmp._8_8_ + 8) = (fVar1 * 0.5 - fVar2 * 0.5) + fVar3 * 0.5;
        *(float *)(tmp._8_8_ + 0xc) = fVar3;
        tmp._8_8_ = tmp._8_8_ + 0x10;
      }
    }
  }
  return;
}

Assistant:

static inline void conv3x3s1_winograd23_transform_kernel_tile(const Mat& kernel, Mat& A, int inch, int i, int max_ii, int k, int max_kk)
{
    // const float ktm[4][3] = {
    //     {1.0f, 0.0f, 0.0f},
    //     {1.0f / 2, 1.0f / 2, 1.0f / 2},
    //     {1.0f / 2, -1.0f / 2, 1.0f / 2},
    //     {0.0f, 0.0f, 1.0f}
    // };

    float* ptmp = A;

    int ii = 0;
    for (; ii < max_ii; ii++)
    {
        int kk = 0;
        for (; kk < max_kk; kk++)
        {
            float tmp[4][3];

            const float* k0 = (const float*)kernel + (i + ii) * inch * 9 + (k + kk) * 9;

            for (int m = 0; m < 3; m++)
            {
                float r0 = k0[0];
                float r1 = k0[1];
                float r2 = k0[2];

                tmp[0][m] = r0;
                tmp[1][m] = r0 * 0.5f + r1 * 0.5f + r2 * 0.5f;
                tmp[2][m] = r0 * 0.5f - r1 * 0.5f + r2 * 0.5f;
                tmp[3][m] = r2;

                k0 += 3;
            }

            for (int m = 0; m < 4; m++)
            {
                float r0 = tmp[m][0];
                float r1 = tmp[m][1];
                float r2 = tmp[m][2];

                float z0 = r0;
                float z1 = r0 * 0.5f + r1 * 0.5f + r2 * 0.5f;
                float z2 = r0 * 0.5f - r1 * 0.5f + r2 * 0.5f;
                float z3 = r2;

                ptmp[0] = z0;
                ptmp[1] = z1;
                ptmp[2] = z2;
                ptmp[3] = z3;
                ptmp += 4;
            }
        }
    }
}